

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::FreeBuffer(CopyingInputStreamAdaptor *this)

{
  uchar *puVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->backup_bytes_ != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x128);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (backup_bytes_) == (0): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  this->buffer_used_ = 0;
  puVar1 = (this->buffer_)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->buffer_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  return;
}

Assistant:

void CopyingInputStreamAdaptor::FreeBuffer() {
  GOOGLE_CHECK_EQ(backup_bytes_, 0);
  buffer_used_ = 0;
  buffer_.reset();
}